

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::commit_app_log
          (raft_server *this,ulong idx_to_commit,ptr<log_entry> *le,bool need_to_handle_commit_elem)

{
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  *this_00;
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this_01;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  iterator __position;
  _List_node_base *p_Var7;
  ulong sm_idx;
  ptr<commit_ret_elem> elem;
  ptr<std::exception> err;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98 [2];
  ptr<buffer> ret_value;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  async_elems;
  unique_lock<std::mutex> cre_lock;
  ptr<buffer> buf;
  
  ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&buf,
             &(((le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
  buffer::pos(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  uVar1 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
  sm_idx = idx_to_commit;
  if (uVar1 < idx_to_commit) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (0 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&err,"pre-commit index %lu is smaller than commit index %lu",uVar1,
                   sm_idx);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_app_log",0x131,&err);
        std::__cxx11::string::~string((string *)&err);
      }
    }
    plVar4 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_
                        ).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar4 + 0x40))(plVar4,0xffffffffffffffe9);
    exit(-1);
  }
  peVar2 = (this->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  async_elems.
  super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)idx_to_commit;
  async_elems.
  super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&buf;
  (*peVar2->_vptr_state_machine[3])(&err,peVar2,(_List_node_base *)&async_elems);
  std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&err);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    buffer::pos(ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  }
  async_elems.
  super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&async_elems;
  async_elems.
  super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&async_elems;
  async_elems.
  super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ._M_impl._M_node._M_size = 0;
  if (!need_to_handle_commit_elem) goto LAB_001921c9;
  std::unique_lock<std::mutex>::unique_lock(&cre_lock,&this->commit_ret_elems_lock_);
  uVar5 = sm_idx;
  this_00 = &this->commit_ret_elems_;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
               ::find(&this_00->_M_t,&sm_idx);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header) {
LAB_00192050:
    if (uVar5 == uVar1) {
      std::make_shared<nuraft::raft_server::commit_ret_elem>();
      (elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->idx_ = sm_idx;
      (elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->result_code_ = OK;
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((elem.
                    super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->ret_value_).
                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                 &ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
        if (5 < iVar6) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&err,
                     "commit thread is invoked earlier than user thread, log %lu, elem %p",sm_idx,
                     elem.
                     super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          (**(code **)(*(long *)peVar3 + 0x40))
                    (peVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_app_log",0x171,&err);
          std::__cxx11::string::~string((string *)&err);
        }
      }
      nuraft::context::get_params((context *)&err);
      iVar6 = *(int *)(err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (iVar6 == 1) {
        std::
        make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&>
                  ((shared_ptr<nuraft::buffer> *)&err);
        std::
        __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&((elem.
                       super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->async_result_).
                     super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&err);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        EventAwaiter::invoke
                  (&(elem.
                     super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->awaiter_);
      }
      err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sm_idx;
      std::__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2> *
                   )&err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &elem.
                    super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                  );
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
      ::
      _M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                  *)this_00,
                 (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)&err
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_98);
      goto LAB_001921b5;
    }
  }
  else {
    std::__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&elem.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2> *)
                  &__position._M_node[1]._M_parent);
    if ((elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->idx_ != sm_idx) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elem.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_00192050;
    }
    (elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->result_code_ = OK;
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((elem.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->ret_value_).
                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
               &ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (4 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&err,"notify cb %lu %p",sm_idx,
                   &(elem.
                     super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->awaiter_);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_app_log",0x151,&err);
        std::__cxx11::string::~string((string *)&err);
      }
    }
    nuraft::context::get_params((context *)&err);
    iVar6 = *(int *)(err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                    0x58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (iVar6 == 1) {
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
      ::push_back(&async_elems,&elem);
LAB_0019219d:
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                          *)this_00,__position);
    }
    else {
      if ((elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->callback_invoked_ != false) goto LAB_0019219d;
      EventAwaiter::invoke
                (&(elem.
                   super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->awaiter_);
    }
LAB_001921b5:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elem.
                super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::unique_lock<std::mutex>::~unique_lock(&cre_lock);
LAB_001921c9:
  p_Var7 = (_List_node_base *)&async_elems;
  while (p_Var7 = (((_List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                     *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)&async_elems) {
    this_01 = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              p_Var7[1]._M_next[0xc]._M_next;
    if (this_01 !=
        (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)0x0) {
      err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                (this_01,(shared_ptr<nuraft::buffer> *)&p_Var7[1]._M_next[10]._M_prev,&err,OK);
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &p_Var7[1]._M_next[10]._M_prev);
      std::
      __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ::reset((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
               *)(p_Var7[1]._M_next + 0xc));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&err.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  ::_M_clear(&async_elems.
              super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::commit_app_log(ulong idx_to_commit,
                                 ptr<log_entry>& le,
                                 bool need_to_handle_commit_elem)
{
    ptr<buffer> ret_value = nullptr;
    ptr<buffer> buf = le->get_buf_ptr();
    buf->pos(0);
    ulong sm_idx = idx_to_commit;
    ulong pc_idx = precommit_index_.load();
    if (pc_idx < sm_idx) {
        // Pre-commit should have been invoked, must be a bug.
        p_ft( "pre-commit index %" PRIu64 " is smaller than commit index %" PRIu64,
              pc_idx, sm_idx );
        ctx_->state_mgr_->system_exit(raft_err::N23_precommit_order_inversion);
        ::exit(-1);
    }
    ret_value = state_machine_->commit_ext
                ( state_machine::ext_op_params( sm_idx, buf ) );
    if (ret_value) ret_value->pos(0);

    std::list< ptr<commit_ret_elem> > async_elems;
    if (need_to_handle_commit_elem) {
        std::unique_lock<std::mutex> cre_lock(commit_ret_elems_lock_);
        /// Sometimes user can batch requests to RAFT: for example send 30
        /// append entries requests in a single batch. For such request batch
        /// user will receive a single response: all was successful or all
        /// failed. Obviously we don't need to add info about responses
        /// (commit_ret_elems) for 29 requests from batch and need to do it only
        /// for 30-th request. precommit_index is exact value which identify ID
        /// of the last request from the latest batch. So if we commiting this
        /// last request and for some reason it was not added into
        /// commit_ret_elems in the handle_cli_req method (logical race
        /// condition) we have to add it here. Otherwise we don't need to add
        /// anything into commit_ret_elems_, because nobody will wait for the
        /// responses of the intermediate requests from requests batch.
        bool need_to_check_commit_ret = sm_idx == pc_idx;

        auto entry = commit_ret_elems_.find(sm_idx);
        if (entry != commit_ret_elems_.end()) {
            ptr<commit_ret_elem> elem = entry->second;
            if (elem->idx_ == sm_idx) {
                elem->result_code_ = cmd_result_code::OK;
                elem->ret_value_ = ret_value;
                need_to_check_commit_ret = false;
                p_dv("notify cb %" PRIu64 " %p", sm_idx, &elem->awaiter_);

                switch (ctx_->get_params()->return_method_) {
                case raft_params::blocking:
                default:
                    // Blocking mode:
                    if (elem->callback_invoked_) {
                        // If elem callback invoked, remove it
                        commit_ret_elems_.erase(entry);
                    } else {
                        // or notify client that request done
                        elem->awaiter_.invoke();
                    }
                    break;

                case raft_params::async_handler:
                    // Async handler: put into list.
                    async_elems.push_back(elem);
                    commit_ret_elems_.erase(entry);
                    break;
                }
            }
        }

        if (need_to_check_commit_ret) {
            // If not found, commit thread is invoked earlier than user thread.
            // Create one here.
            ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
            elem->idx_ = sm_idx;
            elem->result_code_ = cmd_result_code::OK;
            elem->ret_value_ = ret_value;
            p_tr("commit thread is invoked earlier than user thread, "
                 "log %" PRIu64 ", elem %p", sm_idx, elem.get());

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                elem->awaiter_.invoke(); // Callback will not sleep.
                break;
            case raft_params::async_handler:
                // Async handler:
                //   Set the result, but should not put it into the
                //   `async_elems` list, as the user thread (supposed to be
                //   executed right after this) will invoke the callback immediately.
                elem->async_result_ =
                    cs_new< cmd_result< ptr<buffer> > >( elem->ret_value_ );
                break;
            }
            commit_ret_elems_.insert( std::make_pair(sm_idx, elem) );
        }
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: async_elems) {
        ptr<commit_ret_elem>& elem = entry;
        if (elem->async_result_) {
            ptr<std::exception> err = nullptr;
            elem->async_result_->set_result( elem->ret_value_, err, cmd_result_code::OK );
            elem->ret_value_.reset();
            elem->async_result_.reset();
        }
    }
}